

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratMedium.cpp
# Opt level: O0

void __thiscall
primesieve::EratMedium::crossOff_31(EratMedium *this,uint8_t *sieve,size_t sieveSize,Bucket *bucket)

{
  SievingPrime *this_00;
  SievingPrime *pSVar1;
  size_t sVar2;
  Bucket *in_RCX;
  long in_RDI;
  size_t dist6;
  size_t dist2;
  size_t dist1;
  size_t dist0;
  size_t i;
  size_t sievingPrime;
  size_t wheelIndex;
  SievingPrime *end;
  SievingPrime *prime;
  MemoryPool *memoryPool;
  SievingPrime **buckets;
  
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::data
            ((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *)
             (in_RDI + 0x20));
  this_00 = Bucket::begin(in_RCX);
  pSVar1 = Bucket::end(in_RCX);
  sVar2 = SievingPrime::getWheelIndex(this_00);
  if (this_00 != pSVar1) {
    SievingPrime::getSievingPrime(this_00);
    SievingPrime::getMultipleIndex(this_00);
    (*(code *)(&DAT_001ddc38 + *(int *)(&DAT_001ddc38 + (sVar2 - 0x38) * 4)))();
    return;
  }
  return;
}

Assistant:

void EratMedium::crossOff_31(uint8_t* sieve, std::size_t sieveSize, Bucket* bucket)
{
  auto buckets = buckets_.data();
  MemoryPool& memoryPool = *memoryPool_;
  SievingPrime* prime = bucket->begin();
  SievingPrime* end = bucket->end();
  std::size_t wheelIndex = prime->getWheelIndex();

  for (; prime != end; prime++)
  {
    std::size_t sievingPrime = prime->getSievingPrime();
    std::size_t i = prime->getMultipleIndex();
    std::size_t dist0 = sievingPrime * 6 + 1;
    std::size_t dist1 = sievingPrime * 4 + 0;
    std::size_t dist2 = sievingPrime * 2 + 0;
    std::size_t dist6 = sievingPrime * 6 + 0;

    ASSERT(wheelIndex >= 56);
    ASSERT(wheelIndex <= 63);

    switch (wheelIndex)
    {
      default: UNREACHABLE;

      for (;;)
      {
        case 56: CHECK_FINISHED(56); sieve[i] &= BIT7; i += dist0; FALLTHROUGH;
        case 57: CHECK_FINISHED(57); sieve[i] &= BIT0; i += dist1; FALLTHROUGH;
        case 58: CHECK_FINISHED(58); sieve[i] &= BIT1; i += dist2; FALLTHROUGH;
        case 59: CHECK_FINISHED(59); sieve[i] &= BIT2; i += dist1; FALLTHROUGH;
        case 60: CHECK_FINISHED(60); sieve[i] &= BIT3; i += dist2; FALLTHROUGH;
        case 61: CHECK_FINISHED(61); sieve[i] &= BIT4; i += dist1; FALLTHROUGH;
        case 62: CHECK_FINISHED(62); sieve[i] &= BIT5; i += dist6; FALLTHROUGH;
        case 63: CHECK_FINISHED(63); sieve[i] &= BIT6; i += dist2;
      }
    }
  }
}